

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O0

void raviX_buffer_resize(TextBuffer *mb,size_t new_size)

{
  char *pcVar1;
  char *newmem;
  size_t new_size_local;
  TextBuffer *mb_local;
  
  if (mb->capacity < new_size) {
    pcVar1 = (char *)realloc(mb->buf,new_size);
    if (pcVar1 == (char *)0x0) {
      fprintf(_stderr,"Out of memory\n");
      exit(1);
    }
    mb->buf = pcVar1;
    mb->capacity = new_size;
  }
  return;
}

Assistant:

void raviX_buffer_resize(TextBuffer *mb, size_t new_size)
{
	if (new_size <= mb->capacity)
		return;
	char *newmem = (char *)realloc(mb->buf, new_size);
	if (newmem == NULL) {
		fprintf(stderr, "Out of memory\n");
		exit(1);
	}
	mb->buf = newmem;
	mb->capacity = new_size;
}